

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestWriterTestdropNullPlaceholders::runTestCase(TestWriterTestdropNullPlaceholders *this)

{
  byte bVar1;
  byte bVar2;
  char *in_RCX;
  char *in_RDI;
  Value nullValue;
  FastWriter writer;
  char *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  TestResult *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff70;
  undefined1 local_60 [40];
  FastWriter local_38;
  
  Json::FastWriter::FastWriter
            ((FastWriter *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)));
  Json::Value::Value((Value *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (ValueType)((ulong)in_RDI >> 0x20));
  Json::FastWriter::write_abi_cxx11_
            ((FastWriter *)&stack0xffffffffffffff70,(int)&local_38,local_60,(size_t)in_RCX);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff47,
                                   CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
                          in_stack_ffffffffffffff38);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  if ((bVar1 & 1) == 0) {
    in_RCX = "writer.write(nullValue) == \"null\\n\"";
    JsonTest::TestResult::addFailure
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_RDI)
    ;
  }
  Json::FastWriter::dropNullPlaceholders(&local_38);
  Json::FastWriter::write_abi_cxx11_
            ((FastWriter *)&stack0xffffffffffffff50,(int)&local_38,local_60,(size_t)in_RCX);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff46,
                                                  in_stack_ffffffffffffff40)),
                          in_stack_ffffffffffffff38);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  if ((bVar2 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_RDI)
    ;
  }
  Json::Value::~Value((Value *)in_stack_ffffffffffffff70);
  Json::FastWriter::~FastWriter
            ((FastWriter *)CONCAT17(bVar1,CONCAT16(bVar2,in_stack_ffffffffffffff40)));
  return;
}

Assistant:

JSONTEST_FIXTURE(WriterTest, dropNullPlaceholders) {
  Json::FastWriter writer;
  Json::Value nullValue;
  JSONTEST_ASSERT(writer.write(nullValue) == "null\n");

  writer.dropNullPlaceholders();
  JSONTEST_ASSERT(writer.write(nullValue) == "\n");
}